

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O0

ggml_cgraph * gpt2_graph(gpt2_model *model,gpt2_batch *batch,bool measure)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  ggml_cgraph *pgVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  const_reference pvVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  float fVar19;
  ggml_tensor *inpFF;
  ggml_tensor *KQV_merged;
  ggml_tensor *KQV;
  ggml_tensor *V_trans;
  ggml_tensor *KQ_soft_max;
  ggml_tensor *KQ_masked;
  ggml_tensor *KQ_scaled;
  ggml_tensor *KQ;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *cur;
  int il;
  ggml_tensor *KQ_mask;
  ggml_tensor *position;
  ggml_tensor *inp_tokens;
  ggml_tensor *inpL;
  ggml_cgraph *gf;
  ggml_context *ctx;
  ggml_init_params params;
  int32_t kv_head;
  int32_t n_kv;
  int32_t n_tokens;
  gpt2_kv_cache *kv_cache;
  int n_head;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams;
  allocator_type *in_stack_fffffffffffffd10;
  size_type in_stack_fffffffffffffd18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd20;
  int local_148;
  int local_bc;
  undefined8 local_a0;
  
  iVar1 = *(int *)(in_RDI + 8);
  iVar2 = *(int *)(in_RDI + 0x10);
  iVar3 = *(int *)(in_RDI + 4);
  iVar4 = *(int *)(in_RDI + 0xc);
  iVar5 = *in_RSI;
  if ((in_DL & 1) == 0) {
    iVar6 = *(int *)(in_RDI + 0x78);
    local_148 = *(int *)(in_RDI + 0x70);
  }
  else {
    local_148 = iVar3 - iVar5;
    iVar6 = iVar3;
  }
  if ((gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size == '\0') &&
     (iVar7 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size),
     iVar7 != 0)) {
    lVar8 = ggml_tensor_overhead();
    lVar9 = ggml_graph_overhead_custom(0x1000,0);
    gpt2_graph::buf_size = lVar8 * 0x1000 + lVar9;
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size);
  }
  if ((gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf == '\0') &&
     (iVar7 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf),
     iVar7 != 0)) {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x114865);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x114890);
    __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                 &gpt2_graph::buf,&__dso_handle);
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1148d1);
  uVar10 = ggml_init();
  pgVar11 = (ggml_cgraph *)ggml_new_graph_custom(uVar10,0x1000,0);
  if (*(long *)(in_RSI + 2) == 0) {
    if (*(long *)(in_RSI + 4) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                 ,0x248,"GGML_ASSERT(%s) failed","batch.embd");
    }
    local_a0 = ggml_new_tensor_2d(uVar10,0,(long)iVar1,(long)iVar5);
    ggml_set_name(local_a0,"embd");
    ggml_set_input(local_a0);
  }
  else {
    uVar12 = ggml_new_tensor_1d(uVar10,0x1a,(long)iVar5);
    ggml_set_name(uVar12,"inp_tokens");
    ggml_set_input(uVar12);
    uVar13 = ggml_new_tensor_1d(uVar10,0x1a,(long)iVar5);
    ggml_set_name(uVar13,"position");
    ggml_set_input(uVar13);
    uVar12 = ggml_get_rows(uVar10,*(undefined8 *)(in_RDI + 0x30),uVar12);
    uVar13 = ggml_get_rows(uVar10,*(undefined8 *)(in_RDI + 0x38),uVar13);
    local_a0 = ggml_add(uVar10,uVar12,uVar13);
  }
  uVar12 = ggml_new_tensor_3d(uVar10,0,(long)iVar6,(long)iVar5,1);
  ggml_set_name(uVar12,"KQ_mask");
  ggml_set_input(uVar12);
  for (local_bc = 0; local_bc < iVar2; local_bc = local_bc + 1) {
    uVar13 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar10,local_a0);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar13 = ggml_mul(uVar10,uVar13,pvVar14->ln_1_g);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar13 = ggml_add(uVar10,uVar13,pvVar14->ln_1_b);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar13 = ggml_mul_mat(uVar10,pvVar14->c_attn_attn_w,uVar13);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    lVar8 = ggml_add(uVar10,uVar13,pvVar14->c_attn_attn_b);
    uVar13 = ggml_view_2d(uVar10,lVar8,(long)iVar1,(long)iVar5,*(undefined8 *)(lVar8 + 0x38),0);
    uVar15 = ggml_view_2d(uVar10,lVar8,(long)iVar1,(long)iVar5,*(undefined8 *)(lVar8 + 0x38),
                          (long)iVar1 << 2);
    uVar16 = ggml_view_2d(uVar10,lVar8,(long)iVar1,(long)iVar5,*(undefined8 *)(lVar8 + 0x38),
                          (long)iVar1 << 3);
    if (0 < iVar5) {
      uVar18 = *(undefined8 *)(in_RDI + 0x60);
      lVar8 = ggml_element_size(*(undefined8 *)(in_RDI + 0x60));
      uVar17 = ggml_view_1d(uVar10,uVar18,(long)(iVar5 * iVar1),
                            lVar8 * iVar1 * (long)(local_bc * iVar3 + local_148));
      uVar18 = *(undefined8 *)(in_RDI + 0x68);
      lVar8 = ggml_element_size(*(undefined8 *)(in_RDI + 0x68));
      uVar18 = ggml_view_1d(uVar10,uVar18,(long)(iVar5 * iVar1),
                            lVar8 * iVar1 * (long)(local_bc * iVar3 + local_148));
      uVar15 = ggml_cpy(uVar10,uVar15,uVar17);
      ggml_build_forward_expand(pgVar11,uVar15);
      uVar15 = ggml_cpy(uVar10,uVar16,uVar18);
      ggml_build_forward_expand(pgVar11,uVar15);
    }
    uVar15 = uVar10;
    uVar13 = ggml_cont_3d(uVar10,uVar13,(long)(iVar1 / iVar4),(long)iVar4,(long)iVar5);
    uVar15 = ggml_permute(uVar15,uVar13,0,2,1,3);
    uVar13 = *(undefined8 *)(in_RDI + 0x60);
    lVar8 = (long)(local_bc * iVar3);
    lVar9 = ggml_element_size(*(undefined8 *)(in_RDI + 0x60));
    uVar13 = ggml_view_1d(uVar10,uVar13,(long)(iVar6 * iVar1),lVar8 * lVar9 * (long)iVar1);
    uVar13 = ggml_reshape_3d(uVar10,uVar13,(long)(iVar1 / iVar4),(long)iVar4,(long)iVar6);
    uVar13 = ggml_permute(uVar10,uVar13,0,2,1,3);
    uVar13 = ggml_mul_mat(uVar10,uVar13,uVar15);
    fVar19 = sqrtf((float)iVar1 / (float)iVar4);
    uVar13 = ggml_scale(1.0 / fVar19,uVar10,uVar13);
    uVar13 = ggml_add(uVar10,uVar13,uVar12);
    uVar15 = ggml_soft_max(uVar10,uVar13);
    uVar13 = *(undefined8 *)(in_RDI + 0x68);
    lVar8 = ggml_element_size(*(undefined8 *)(in_RDI + 0x68));
    uVar13 = ggml_view_1d(uVar10,uVar13,(long)(iVar6 * iVar1),
                          (local_bc * iVar3) * lVar8 * (long)iVar1);
    uVar13 = ggml_reshape_3d(uVar10,uVar13,(long)(iVar1 / iVar4),(long)iVar4,(long)iVar6);
    uVar13 = ggml_permute(uVar10,uVar13,1,2,0,3);
    uVar13 = ggml_cont_3d(uVar10,uVar13,(long)iVar6,(long)(iVar1 / iVar4),(long)iVar4);
    uVar13 = ggml_mul_mat(uVar10,uVar13,uVar15);
    uVar13 = ggml_permute(uVar10,uVar13,0,2,1,3);
    uVar13 = ggml_cont_2d(uVar10,uVar13,(long)iVar1,(long)iVar5);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar13 = ggml_mul_mat(uVar10,pvVar14->c_attn_proj_w,uVar13);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar13 = ggml_add(uVar10,uVar13,pvVar14->c_attn_proj_b);
    uVar13 = ggml_add(uVar10,uVar13,local_a0);
    uVar15 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar10,uVar13);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_mul(uVar10,uVar15,pvVar14->ln_2_g);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_add(uVar10,uVar15,pvVar14->ln_2_b);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_mul_mat(uVar10,pvVar14->c_mlp_fc_w,uVar15);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_add(uVar10,uVar15,pvVar14->c_mlp_fc_b);
    uVar15 = ggml_gelu(uVar10,uVar15);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_mul_mat(uVar10,pvVar14->c_mlp_proj_w,uVar15);
    pvVar14 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                        ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)(in_RDI + 0x48),
                         (long)local_bc);
    uVar15 = ggml_add(uVar10,uVar15,pvVar14->c_mlp_proj_b);
    local_a0 = ggml_add(uVar10,uVar15,uVar13);
  }
  uVar13 = ggml_norm(*(undefined4 *)(in_RDI + 0x18),uVar10,local_a0);
  uVar12 = uVar10;
  uVar13 = ggml_mul(uVar10,uVar13,*(undefined8 *)(in_RDI + 0x20));
  uVar12 = ggml_add(uVar12,uVar13,*(undefined8 *)(in_RDI + 0x28));
  uVar12 = ggml_mul_mat(uVar10,*(undefined8 *)(in_RDI + 0x40),uVar12);
  ggml_build_forward_expand(pgVar11,uVar12);
  ggml_free(uVar10);
  return pgVar11;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const  gpt2_model  & model,
        const  gpt2_batch  & batch,
                     bool    measure) {
    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    const auto & kv_cache = model.kv_cache;

    const int32_t n_tokens = batch.n_tokens;
    const int32_t n_kv     = measure ? n_ctx            : kv_cache.n;
    const int32_t kv_head  = measure ? n_ctx - n_tokens : kv_cache.head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * inpL;
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, n_tokens);
        ggml_set_name(inp_tokens, "inp_tokens");
        ggml_set_input(inp_tokens);

        struct ggml_tensor * position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, n_tokens);
        ggml_set_name(position, "position");
        ggml_set_input(position);

        // wte + wpe
        inpL =
            ggml_add(ctx,
                    ggml_get_rows(ctx, model.wte, inp_tokens),
                    ggml_get_rows(ctx, model.wpe, position));
    } else {
        GGML_ASSERT(batch.embd);

        inpL = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_tokens);
        ggml_set_name(inpL, "embd");
        ggml_set_input(inpL);
    }

    // KQ_mask (mask for 1 head, it will be broadcasted to all heads)
    struct ggml_tensor * KQ_mask = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, n_kv, n_tokens, 1);
    ggml_set_name(KQ_mask, "KQ_mask");
    ggml_set_input(KQ_mask);


    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
        }

        // attn
        // [2304,        768] - model.layers[il].c_attn_attn_w
        // [2304,          1] - model.layers[il].c_attn_attn_b
        // [ 768,   n_tokens] - cur (in)
        // [2304,   n_tokens] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, n_tokens]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (n_tokens >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.kv_cache.k, n_tokens*n_embd, (ggml_element_size(model.kv_cache.k)*n_embd)*(il*n_ctx + kv_head));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.kv_cache.v, n_tokens*n_embd, (ggml_element_size(model.kv_cache.v)*n_embd)*(il*n_ctx + kv_head));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx,
                            Qcur,
                            n_embd/n_head, n_head, n_tokens),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_kv).permute(0, 2, 1, 3)
            // [64, n_kv, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.kv_cache.k, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.k)*n_embd),
                            n_embd/n_head, n_head, n_kv),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.kv_cache.v, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.v)*n_embd),
            //                    n_embd/n_head, n_head, n_kv),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_kv, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ_scaled =
                ggml_scale(ctx,
                        KQ,
                        1.0f/sqrtf(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ_masked = ggml_add(ctx, KQ_scaled, KQ_mask);

            // KQ = soft_max(KQ_masked)
            // [n_kv, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_kv).permute(1, 2, 0, 3).contiguous()
            // [n_kv, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.kv_cache.v, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.v)*n_embd),
                                n_embd/n_head, n_head, n_kv),
                            1, 2, 0, 3),
                        n_kv, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, n_tokens, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, n_tokens]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, n_tokens]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, n_tokens);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}